

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GeomPrimvar::flatten_with_indices<std::array<double,4ul>>
          (GeomPrimvar *this,double t,
          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *dest,
          TimeSampleInterpolationType tinterp,string *err)

{
  Attribute *this_00;
  bool bVar1;
  uint32_t tyid;
  error_type *__rhs;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *in_R9;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *values;
  allocator local_121;
  double local_120;
  vector<int,_std::allocator<int>_> indices;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> value;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> expanded_val;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  string local_90;
  string local_70;
  string local_50;
  
  if (dest == (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)0x0) {
    if (err == (string *)0x0) {
      return false;
    }
    std::__cxx11::string::append((char *)err);
    return false;
  }
  args = err;
  local_120 = t;
  if ((*(pointer *)
        ((long)&(this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data + 8) ==
       (this->_attr)._var._ts._samples.
       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ._M_impl.super__Vector_impl_data._M_start) &&
     (bVar1 = primvar::PrimVar::has_value(&(this->_attr)._var), !bVar1)) {
    return false;
  }
  this_00 = &this->_attr;
  tyid = Attribute::type_id(this_00);
  bVar1 = IsSupportedGeomPrimvarType(tyid);
  if (!bVar1) {
    if (err == (string *)0x0) {
      return false;
    }
    std::__cxx11::string::string
              ((string *)&local_90,"Unsupported type for GeomPrimvar. type = `{}`",
               (allocator *)&local_70);
    Attribute::type_name_abi_cxx11_(&local_50,this_00);
    fmt::format<std::__cxx11::string>((string *)&ret,(fmt *)&local_90,&local_50,args);
    std::__cxx11::string::append((string *)err);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    return false;
  }
  value.super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  value.super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  value.super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Attribute::get<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                    (this_00,local_120,&value,tinterp);
  if (!bVar1) {
    if (err != (string *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_90,"`{}[]` type requested, but Attribute is type `{}`",
                 (allocator *)&indices);
      tinyusdz::value::TypeTraits<std::array<double,4ul>>::type_name_abi_cxx11_();
      Attribute::type_name_abi_cxx11_(&local_70,this_00);
      fmt::format<std::__cxx11::string,std::__cxx11::string>
                ((string *)&ret,(fmt *)&local_90,&local_50,&local_70,in_R8);
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    goto LAB_0016e2c3;
  }
  if ((this->_attr)._metas.elementSize.has_value_ == false) {
    values = (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)0x1;
  }
  else {
    values = (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
             (ulong)(uint)(this->_attr)._metas.elementSize.contained;
  }
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if (NAN(local_120)) {
    if ((this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar1 = has_timesampled_indices(this);
      if (bVar1) goto LAB_0016e18f;
    }
    else {
      std::vector<int,_std::allocator<int>_>::operator=(&indices,&this->_indices);
    }
  }
  else {
LAB_0016e18f:
    TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::
    get<std::vector<int,_std::allocator<int>_>,_nullptr>
              (&this->_ts_indices,&indices,local_120,tinterp);
  }
  expanded_val.
  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  expanded_val.
  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  expanded_val.
  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&indices;
  (anonymous_namespace)::ExpandWithIndices<std::array<double,4ul>>
            (&ret,(_anonymous_namespace_ *)&value,values,(uint32_t)args_00,
             (vector<int,_std::allocator<int>_> *)&expanded_val,in_R9);
  if (ret.contained.
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == true) {
    std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::operator=
              (dest,&expanded_val);
  }
  else {
    __rhs = nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::error(&ret);
    if (err != (string *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"[Internal Error] Failed to expand for GeomPrimvar type = `{}`"
                 ,&local_121);
      Attribute::type_name_abi_cxx11_(&local_70,this_00);
      fmt::format<std::__cxx11::string>(&local_90,(fmt *)&local_50,&local_70,args_00);
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      if (__rhs->_M_string_length != 0) {
        std::operator+(&local_90,"\n",__rhs);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
      }
    }
  }
  nonstd::expected_lite::
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~expected(&ret);
  std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
  ~_Vector_base(&expanded_val.
                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
               );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indices.super__Vector_base<int,_std::allocator<int>_>);
  if (ret.contained.
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value != false) {
    std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
    ~_Vector_base(&value.
                   super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                 );
    return true;
  }
LAB_0016e2c3:
  std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
  ~_Vector_base(&value.
                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
               );
  return false;
}

Assistant:

bool GeomPrimvar::flatten_with_indices(const double t, std::vector<T> *dest, const value::TimeSampleInterpolationType tinterp, std::string *err) const {
  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.has_timesamples() || _attr.has_value()) {

    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    std::vector<T> value;
    if (_attr.get_value<std::vector<T>>(t, &value, tinterp)) {

      uint32_t elementSize = _attr.metas().elementSize.value_or(1);

      // Get indices at specified time
      std::vector<int32_t> indices;
      if (value::TimeCode(t).is_default()) {
        if (has_default_indices()) {
          indices = _indices;
        } else if (has_timesampled_indices()) {
          _ts_indices.get(&indices, t, tinterp);
        }
      } else {
        _ts_indices.get(&indices, t, tinterp);
      }

      std::vector<T> expanded_val;
      auto ret = ExpandWithIndices(value, elementSize, indices, &expanded_val);
      if (ret) {
        (*dest) = expanded_val;
        // Currently we ignore ret.value()
        return true;
      } else {
        const std::string &err_msg = ret.error();
        if (err) {
          (*err) += fmt::format(
              "[Internal Error] Failed to expand for GeomPrimvar type = `{}`",
              _attr.type_name());
          if (err_msg.size()) {
            (*err) += "\n" + err_msg;
          }
        }
      }
    } else {
      if (err) {
        (*err) += fmt::format(
            "`{}[]` type requested, but Attribute is type `{}`",
            value::TypeTraits<T>::type_name(), _attr.type_name());
      }
    }
  } else {
    // TODO: Report error?
  }

  return false;
}